

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O2

int isNonTemporalSubformula(ltlNode *topNode)

{
  int iVar1;
  long lVar2;
  
  do {
    switch(topNode->type) {
    case AND:
    case OR:
    case IMPLY:
      iVar1 = isNonTemporalSubformula(topNode->left);
      lVar2 = 0x20;
      if (iVar1 == 0) {
        return 0;
      }
      break;
    case NOT:
      lVar2 = 0x18;
      if (topNode->right != (ltlNode_t *)0x0) {
        __assert_fail("topNode->right == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/ltl_parser.c"
                      ,0x28c,"int isNonTemporalSubformula(ltlNode *)");
      }
      break;
    default:
      return 0;
    case BOOL:
      return 1;
    }
    topNode = *(ltlNode **)((long)&topNode->type + lVar2);
  } while( true );
}

Assistant:

int isNonTemporalSubformula( ltlNode *topNode )
{
	switch( topNode->type ){
		case AND:
		case OR:
		case IMPLY:
			return isNonTemporalSubformula( topNode->left) && isNonTemporalSubformula( topNode->right ) ;
		case NOT:
			assert( topNode->right == NULL );
			return isNonTemporalSubformula( topNode->left );
		case BOOL:
			return 1;
		default:
			return 0;
	}
}